

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpConnection.cpp
# Opt level: O1

bool __thiscall
gmlc::networking::TcpConnection::waitUntilConnected(TcpConnection *this,milliseconds timeOut)

{
  byte bVar1;
  milliseconds local_10;
  
  if ((((this->connected).activated._M_base._M_i & 1U) == 0) ||
     (bVar1 = 1, ((this->connectionError)._M_base._M_i & 1U) != 0)) {
    local_10.__r = timeOut.__r;
    if (timeOut.__r < 0) {
      concurrency::TriggerVariable::waitActivation(&this->connected);
    }
    else {
      concurrency::TriggerVariable::wait_forActivation(&this->connected,&local_10);
    }
    if (((this->connected).activated._M_base._M_i & 1U) == 0) {
      bVar1 = 0;
    }
    else {
      bVar1 = (this->connectionError)._M_base._M_i ^ 1;
    }
  }
  return (bool)(bVar1 & 1);
}

Assistant:

bool TcpConnection::waitUntilConnected(std::chrono::milliseconds timeOut)
{
    if (isConnected()) {
        return true;
    }
    if (timeOut < 0ms) {
        connected.waitActivation();
        return isConnected();
    }
    connected.wait_forActivation(timeOut);
    return isConnected();
}